

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8 *ptr,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  string *str;
  
  if ((*(ulong *)(ptr + offset) & 1) == 0) {
    InitProtobufDefaults();
    str = (string *)&fixed_address_empty_string_abi_cxx11_;
  }
  else {
    str = (string *)((*(ulong *)(ptr + offset) & 0xfffffffffffffffe) + 8);
  }
  io::CodedOutputStream::WriteString(output,str);
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8* ptr, uint32 offset, uint32 tag,
                                uint32 has_offset,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}